

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFUsedFont.cpp
# Opt level: O0

double __thiscall
PDFUsedFont::CalculateTextAdvance(PDFUsedFont *this,string *inText,double inFontSize)

{
  double dVar1;
  undefined1 local_38 [8];
  UIntList glyphs;
  double inFontSize_local;
  string *inText_local;
  PDFUsedFont *this_local;
  
  glyphs.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node._M_size =
       (size_t)inFontSize;
  std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::list
            ((list<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
  GetUnicodeGlyphs(this,inText,(list<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
  dVar1 = CalculateTextAdvance
                    (this,(UIntList *)local_38,
                     (double)glyphs.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>.
                             _M_impl._M_node._M_size);
  std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::~list
            ((list<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
  return dVar1;
}

Assistant:

double PDFUsedFont::CalculateTextAdvance(const std::string& inText,double inFontSize)
{
	UIntList glyphs;
	GetUnicodeGlyphs(inText, glyphs);
	return CalculateTextAdvance(glyphs,inFontSize);
}